

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_jnt_convolve_avx2.c
# Opt level: O0

void av1_highbd_dist_wtd_convolve_2d_copy_avx2
               (uint16_t *src,int src_stride,uint16_t *dst0,int dst_stride0,int w,int h,
               ConvolveParams *conv_params,int bd)

{
  undefined1 (*pauVar1) [32];
  int iVar2;
  int iVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  char cVar17;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  ushort uVar18;
  uint uVar19;
  uint uVar20;
  undefined8 *puVar21;
  int in_ECX;
  uint uVar22;
  long in_RDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  int *in_stack_00000008;
  __m128i res_1_3;
  __m128i res_0_3;
  __m256i res_unsigned_16b_2;
  __m128i res_1_2;
  __m128i res_0_2;
  __m256i res_clip_2;
  __m256i res_16b_2;
  __m256i round_result_hi_1;
  __m256i round_result_lo_1;
  __m256i comp_avg_res_hi_1;
  __m256i res_unsigned_hi_1;
  __m256i res_32b_hi_1;
  __m256i comp_avg_res_lo_1;
  __m256i res_unsigned_lo_2;
  __m256i res_32b_lo_1;
  __m256i data_ref_0_hi_1;
  __m256i data_ref_0_lo_1;
  __m256i data_01_1;
  __m256i data_1_1;
  __m256i data_0_2;
  __m128i res_1_1;
  __m128i res_0_1;
  __m256i res_unsigned_16b_1;
  __m128i res_1;
  __m128i res_0;
  __m256i res_clip_1;
  __m256i res_16b_1;
  __m256i round_result;
  __m256i comp_avg_res;
  __m256i res_unsigned_lo_1;
  __m256i res_32b;
  __m256i data_ref_0;
  __m256i data_01;
  __m256i data_1;
  __m256i data_0_1;
  __m256i res_2;
  __m256i src_10;
  __m128i src_row_1;
  __m128i src_row_0;
  __m256i res_unsigned_16b;
  __m256i res_clip;
  __m256i res_16b;
  __m256i round_result_hi;
  __m256i round_result_lo;
  __m256i comp_avg_res_hi;
  __m256i res_unsigned_hi;
  __m256i res_32b_hi;
  __m256i comp_avg_res_lo;
  __m256i res_unsigned_lo;
  __m256i res_32b_lo;
  __m256i data_ref_0_hi;
  __m256i data_ref_0_lo;
  __m256i data_0;
  __m256i res;
  __m256i src_16bit;
  __m256i clip_pixel_to_bd;
  __m256i rounding_const;
  int rounding_shift;
  __m256i offset_const_16b;
  __m256i offset_const;
  int offset;
  int offset_0;
  int j;
  int i;
  __m256i zero;
  __m256i wt1;
  __m256i wt0;
  int w1;
  int w0;
  int use_dist_wtd_comp_avg;
  int do_average;
  __m128i left_shift;
  int bits;
  int dst_stride;
  CONV_BUF_TYPE *dst;
  undefined2 in_stack_ffffffffffffec9c;
  int round_shift;
  undefined4 uVar28;
  uint uVar29;
  uint uVar30;
  undefined3 in_stack_ffffffffffffecac;
  undefined4 uVar31;
  undefined4 uVar32;
  undefined8 local_1320;
  undefined8 uStack_1318;
  undefined8 uStack_1310;
  undefined8 uStack_1308;
  undefined8 in_stack_ffffffffffffed10;
  int use_dist_wtd_comp_avg_00;
  __m256i *in_stack_ffffffffffffed18;
  __m256i *wt0_00;
  undefined1 local_12e0 [32];
  undefined8 uStack_12c8;
  undefined8 local_1100;
  undefined8 uStack_10d0;
  undefined8 local_10c0;
  undefined8 uStack_1090;
  undefined8 uStack_f30;
  undefined8 uStack_f28;
  undefined8 local_f00;
  undefined8 uStack_ef8;
  undefined8 uStack_ef0;
  undefined8 uStack_ee8;
  undefined8 local_ee0;
  undefined8 uStack_ed8;
  undefined8 uStack_ed0;
  undefined8 uStack_ec8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  byte local_ca4;
  ushort local_c50;
  byte local_c4c;
  int local_c48;
  int local_c44;
  ulong local_b70;
  ulong uStack_b38;
  undefined8 uStack_130;
  undefined8 uStack_128;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  __m256i *res_unsigned;
  __m256i *data_ref_0_00;
  
  lVar4 = *(long *)(in_stack_00000008 + 2);
  iVar2 = in_stack_00000008[4];
  uVar32 = 0xe;
  uVar19 = 0xe - (in_stack_00000008[6] + in_stack_00000008[5]);
  local_b70 = CONCAT44(0,uVar19);
  iVar3 = *in_stack_00000008;
  uVar29 = in_stack_00000008[10];
  uVar30 = in_stack_00000008[0xb];
  auVar5 = vpinsrd_avx(ZEXT416(uVar29),uVar29,1);
  auVar5 = vpinsrd_avx(auVar5,uVar29,2);
  vpinsrd_avx(auVar5,uVar29,3);
  auVar5 = vpinsrd_avx(ZEXT416(uVar29),uVar29,1);
  auVar5 = vpinsrd_avx(auVar5,uVar29,2);
  vpinsrd_avx(auVar5,uVar29,3);
  auVar5 = vpinsrd_avx(ZEXT416(uVar30),uVar30,1);
  auVar5 = vpinsrd_avx(auVar5,uVar30,2);
  vpinsrd_avx(auVar5,uVar30,3);
  auVar5 = vpinsrd_avx(ZEXT416(uVar30),uVar30,1);
  auVar5 = vpinsrd_avx(auVar5,uVar30,2);
  vpinsrd_avx(auVar5,uVar30,3);
  uStack_b38 = SUB328(ZEXT832(0),4);
  cVar17 = ((char)conv_params - (char)in_stack_00000008[5]) - (char)in_stack_00000008[6];
  local_c4c = cVar17 + 0xe;
  uVar31 = CONCAT13(local_c4c,in_stack_ffffffffffffecac);
  uVar22 = (1 << (local_c4c & 0x1f)) + (1 << (cVar17 + 0xdU & 0x1f));
  auVar5 = vpinsrd_avx(ZEXT416(uVar22),uVar22,1);
  auVar5 = vpinsrd_avx(auVar5,uVar22,2);
  auVar5 = vpinsrd_avx(auVar5,uVar22,3);
  auVar26 = vpinsrd_avx(ZEXT416(uVar22),uVar22,1);
  auVar26 = vpinsrd_avx(auVar26,uVar22,2);
  auVar26 = vpinsrd_avx(auVar26,uVar22,3);
  uStack_130 = auVar26._0_8_;
  uStack_128 = auVar26._8_8_;
  local_c50 = (ushort)uVar22;
  auVar26 = vpinsrw_avx(ZEXT216(local_c50),uVar22 & 0xffff,1);
  auVar26 = vpinsrw_avx(auVar26,uVar22 & 0xffff,2);
  auVar26 = vpinsrw_avx(auVar26,uVar22 & 0xffff,3);
  auVar26 = vpinsrw_avx(auVar26,uVar22 & 0xffff,4);
  auVar26 = vpinsrw_avx(auVar26,uVar22 & 0xffff,5);
  auVar26 = vpinsrw_avx(auVar26,uVar22 & 0xffff,6);
  auVar6 = vpinsrw_avx(auVar26,uVar22 & 0xffff,7);
  auVar26 = vpinsrw_avx(ZEXT216(local_c50),uVar22 & 0xffff,1);
  auVar26 = vpinsrw_avx(auVar26,uVar22 & 0xffff,2);
  auVar26 = vpinsrw_avx(auVar26,uVar22 & 0xffff,3);
  auVar26 = vpinsrw_avx(auVar26,uVar22 & 0xffff,4);
  auVar26 = vpinsrw_avx(auVar26,uVar22 & 0xffff,5);
  auVar26 = vpinsrw_avx(auVar26,uVar22 & 0xffff,6);
  auVar26 = vpinsrw_avx(auVar26,uVar22 & 0xffff,7);
  uStack_b0 = auVar26._0_8_;
  uStack_a8 = auVar26._8_8_;
  local_ca4 = 0xe - ((char)in_stack_00000008[5] + (char)in_stack_00000008[6]);
  uVar20 = (1 << (local_ca4 & 0x1f)) >> 1;
  auVar26 = vpinsrd_avx(ZEXT416(uVar20),uVar20,1);
  auVar26 = vpinsrd_avx(auVar26,uVar20,2);
  vpinsrd_avx(auVar26,uVar20,3);
  auVar26 = vpinsrd_avx(ZEXT416(uVar20),uVar20,1);
  auVar26 = vpinsrd_avx(auVar26,uVar20,2);
  vpinsrd_avx(auVar26,uVar20,3);
  if ((int)conv_params == 10) {
    uVar28 = 0x3ff;
  }
  else {
    uVar28 = 0xff;
    if ((int)conv_params == 0xc) {
      uVar28 = 0xfff;
    }
  }
  uVar18 = (ushort)uVar28;
  round_shift = CONCAT22(uVar18,in_stack_ffffffffffffec9c);
  auVar26 = vpinsrw_avx(ZEXT216(uVar18),uVar28,1);
  auVar26 = vpinsrw_avx(auVar26,uVar28,2);
  auVar26 = vpinsrw_avx(auVar26,uVar28,3);
  auVar26 = vpinsrw_avx(auVar26,uVar28,4);
  auVar26 = vpinsrw_avx(auVar26,uVar28,5);
  auVar26 = vpinsrw_avx(auVar26,uVar28,6);
  auVar26 = vpinsrw_avx(auVar26,uVar28,7);
  auVar23 = vpinsrw_avx(ZEXT216(uVar18),uVar28,1);
  auVar23 = vpinsrw_avx(auVar23,uVar28,2);
  auVar23 = vpinsrw_avx(auVar23,uVar28,3);
  auVar23 = vpinsrw_avx(auVar23,uVar28,4);
  auVar23 = vpinsrw_avx(auVar23,uVar28,5);
  auVar23 = vpinsrw_avx(auVar23,uVar28,6);
  auVar23 = vpinsrw_avx(auVar23,uVar28,7);
  auVar23 = ZEXT116(0) * auVar26 + ZEXT116(1) * auVar23;
  auVar26 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar26;
  uStack_cf0 = auVar26._0_8_;
  uStack_ce8 = auVar26._8_8_;
  if (in_R8D % 0x10 == 0) {
    for (local_c44 = 0; local_c44 < in_R9D; local_c44 = local_c44 + 1) {
      for (local_c48 = 0; local_c48 < in_R8D; local_c48 = local_c48 + 0x10) {
        auVar27._8_8_ = 0;
        auVar27._0_8_ = local_b70;
        auVar24 = vpsllw_avx2(*(undefined1 (*) [32])
                               (in_RDI + (long)(local_c44 * in_ESI + local_c48) * 2),auVar27);
        if (iVar3 == 0) {
          auVar16._16_8_ = uStack_b0;
          auVar16._0_16_ = auVar6;
          auVar16._24_8_ = uStack_a8;
          auVar24 = vpaddusw_avx2(auVar24,auVar16);
          puVar21 = (undefined8 *)(lVar4 + (long)(local_c44 * iVar2 + local_c48) * 2);
          local_f00 = auVar24._0_8_;
          uStack_ef8 = auVar24._8_8_;
          uStack_ef0 = auVar24._16_8_;
          uStack_ee8 = auVar24._24_8_;
          *puVar21 = local_f00;
          puVar21[1] = uStack_ef8;
          puVar21[2] = uStack_ef0;
          puVar21[3] = uStack_ee8;
        }
        else {
          pauVar1 = (undefined1 (*) [32])(lVar4 + (long)(local_c44 * iVar2 + local_c48) * 2);
          vpunpcklwd_avx2(*pauVar1,ZEXT832(uStack_b38) << 0x40);
          vpunpckhwd_avx2(*pauVar1,ZEXT832(uStack_b38) << 0x40);
          auVar25 = vpunpcklwd_avx2(auVar24,ZEXT832(uStack_b38) << 0x40);
          auVar11._16_8_ = uStack_130;
          auVar11._0_16_ = auVar5;
          auVar11._24_8_ = uStack_128;
          vpaddd_avx2(auVar25,auVar11);
          highbd_comp_avg(data_ref_0_00,res_unsigned,wt0_00,in_stack_ffffffffffffed18,
                          (int)((ulong)in_stack_ffffffffffffed10 >> 0x20));
          auVar24 = vpunpckhwd_avx2(auVar24,ZEXT832(uStack_b38) << 0x40);
          auVar10._16_8_ = uStack_130;
          auVar10._0_16_ = auVar5;
          auVar10._24_8_ = uStack_128;
          auVar24 = vpaddd_avx2(auVar24,auVar10);
          highbd_comp_avg(data_ref_0_00,res_unsigned,wt0_00,in_stack_ffffffffffffed18,
                          (int)((ulong)in_stack_ffffffffffffed10 >> 0x20));
          highbd_convolve_rounding
                    ((__m256i *)CONCAT44(uVar22,uVar32),(__m256i *)CONCAT44(uVar31,uVar30),
                     (__m256i *)CONCAT44(uVar29,uVar28),round_shift);
          auVar25 = auVar24;
          highbd_convolve_rounding
                    ((__m256i *)CONCAT44(uVar22,uVar32),(__m256i *)CONCAT44(uVar31,uVar30),
                     (__m256i *)CONCAT44(uVar29,uVar28),round_shift);
          auVar24 = vpackusdw_avx2(auVar24,auVar25);
          auVar14._16_8_ = uStack_cf0;
          auVar14._0_16_ = auVar23;
          auVar14._24_8_ = uStack_ce8;
          auVar24 = vpminsw_avx2(auVar24,auVar14);
          puVar21 = (undefined8 *)(in_RDX + (long)(local_c44 * in_ECX + local_c48) * 2);
          local_ee0 = auVar24._0_8_;
          uStack_ed8 = auVar24._8_8_;
          uStack_ed0 = auVar24._16_8_;
          uStack_ec8 = auVar24._24_8_;
          *puVar21 = local_ee0;
          puVar21[1] = uStack_ed8;
          puVar21[2] = uStack_ed0;
          puVar21[3] = uStack_ec8;
        }
      }
    }
  }
  else if (in_R8D % 4 == 0) {
    for (local_c44 = 0; local_c44 < in_R9D; local_c44 = local_c44 + 2) {
      for (local_c48 = 0; use_dist_wtd_comp_avg_00 = (int)((ulong)in_stack_ffffffffffffed10 >> 0x20)
          , local_c48 < in_R8D; local_c48 = local_c48 + 8) {
        auVar26 = *(undefined1 (*) [16])
                   (in_RDI + (long)(local_c44 * in_ESI + local_c48 + in_ESI) * 2);
        auVar27 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar26;
        uStack_f30 = auVar27._0_8_;
        uStack_f28 = auVar27._8_8_;
        auVar24._16_8_ = uStack_f30;
        auVar24._0_16_ =
             ZEXT116(0) * auVar26 +
             ZEXT116(1) *
             *(undefined1 (*) [16])(in_RDI + (long)(local_c44 * in_ESI + local_c48) * 2);
        auVar24._24_8_ = uStack_f28;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = local_b70;
        auVar24 = vpsllw_avx2(auVar24,auVar26);
        if (in_R8D - local_c48 < 8) {
          if (iVar3 == 0) {
            auVar15._16_8_ = uStack_b0;
            auVar15._0_16_ = auVar6;
            auVar15._24_8_ = uStack_a8;
            auVar24 = vpaddusw_avx2(auVar24,auVar15);
            uStack_10d0 = auVar24._16_8_;
            *(undefined8 *)(lVar4 + (long)(local_c44 * iVar2 + local_c48) * 2) = uStack_10d0;
            *(undefined8 *)(lVar4 + (long)(local_c44 * iVar2 + local_c48 + iVar2) * 2) = local_1100;
          }
          else {
            auVar25 = vperm2i128_avx2(ZEXT2032(CONCAT416(uVar19,CONCAT88(0,*(ulong *)(lVar4 + (long)
                                                  (local_c44 * iVar2 + local_c48) * 2)))),
                                      ZEXT2032(CONCAT416(uVar19,CONCAT88(0,*(ulong *)(lVar4 + (long)
                                                  (local_c44 * iVar2 + local_c48 + iVar2) * 2)))),
                                      0x20);
            vpunpcklwd_avx2(auVar25,ZEXT832(uStack_b38) << 0x40);
            auVar24 = vpunpcklwd_avx2(auVar24,ZEXT832(uStack_b38) << 0x40);
            auVar9._16_8_ = uStack_130;
            auVar9._0_16_ = auVar5;
            auVar9._24_8_ = uStack_128;
            auVar24 = vpaddd_avx2(auVar24,auVar9);
            highbd_comp_avg(data_ref_0_00,res_unsigned,wt0_00,in_stack_ffffffffffffed18,
                            use_dist_wtd_comp_avg_00);
            highbd_convolve_rounding
                      ((__m256i *)CONCAT44(uVar22,uVar32),(__m256i *)CONCAT44(uVar31,uVar30),
                       (__m256i *)CONCAT44(uVar29,uVar28),round_shift);
            auVar24 = vpackusdw_avx2(auVar24,auVar24);
            auVar13._16_8_ = uStack_cf0;
            auVar13._0_16_ = auVar23;
            auVar13._24_8_ = uStack_ce8;
            auVar24 = vpminsw_avx2(auVar24,auVar13);
            uStack_1090 = auVar24._16_8_;
            *(undefined8 *)(in_RDX + (long)(local_c44 * in_ECX + local_c48) * 2) = uStack_1090;
            *(undefined8 *)(in_RDX + (long)(local_c44 * in_ECX + local_c48 + in_ECX) * 2) =
                 local_10c0;
          }
        }
        else if (iVar3 == 0) {
          auVar25._16_8_ = uStack_b0;
          auVar25._0_16_ = auVar6;
          auVar25._24_8_ = uStack_a8;
          auVar24 = vpaddusw_avx2(auVar24,auVar25);
          local_1320 = auVar24._0_8_;
          uStack_1318 = auVar24._8_8_;
          uStack_1310 = auVar24._16_8_;
          uStack_1308 = auVar24._24_8_;
          puVar21 = (undefined8 *)(lVar4 + (long)(local_c44 * iVar2 + local_c48) * 2);
          *puVar21 = local_1320;
          puVar21[1] = uStack_1318;
          puVar21 = (undefined8 *)(lVar4 + (long)(local_c44 * iVar2 + local_c48 + iVar2) * 2);
          *puVar21 = uStack_1310;
          puVar21[1] = uStack_1308;
        }
        else {
          auVar25 = vperm2i128_avx2(ZEXT2032(CONCAT416(uVar19,*(undefined1 (*) [16])
                                                               (lVar4 + (long)(local_c44 * iVar2 +
                                                                              local_c48) * 2))),
                                    ZEXT2032(CONCAT416(uVar19,*(undefined1 (*) [16])
                                                               (lVar4 + (long)(local_c44 * iVar2 +
                                                                               local_c48 + iVar2) *
                                                                        2))),0x20);
          vpunpcklwd_avx2(auVar25,ZEXT832(uStack_b38) << 0x40);
          vpunpckhwd_avx2(auVar25,ZEXT832(uStack_b38) << 0x40);
          auVar25 = vpunpcklwd_avx2(auVar24,ZEXT832(uStack_b38) << 0x40);
          auVar8._16_8_ = uStack_130;
          auVar8._0_16_ = auVar5;
          auVar8._24_8_ = uStack_128;
          vpaddd_avx2(auVar25,auVar8);
          highbd_comp_avg(data_ref_0_00,res_unsigned,wt0_00,in_stack_ffffffffffffed18,
                          use_dist_wtd_comp_avg_00);
          auVar24 = vpunpckhwd_avx2(auVar24,ZEXT832(uStack_b38) << 0x40);
          auVar7._16_8_ = uStack_130;
          auVar7._0_16_ = auVar5;
          auVar7._24_8_ = uStack_128;
          auVar24 = vpaddd_avx2(auVar24,auVar7);
          highbd_comp_avg(data_ref_0_00,res_unsigned,wt0_00,in_stack_ffffffffffffed18,
                          use_dist_wtd_comp_avg_00);
          highbd_convolve_rounding
                    ((__m256i *)CONCAT44(uVar22,uVar32),(__m256i *)CONCAT44(uVar31,uVar30),
                     (__m256i *)CONCAT44(uVar29,uVar28),round_shift);
          auVar25 = auVar24;
          highbd_convolve_rounding
                    ((__m256i *)CONCAT44(uVar22,uVar32),(__m256i *)CONCAT44(uVar31,uVar30),
                     (__m256i *)CONCAT44(uVar29,uVar28),round_shift);
          auVar24 = vpackusdw_avx2(auVar24,auVar25);
          auVar12._16_8_ = uStack_cf0;
          auVar12._0_16_ = auVar23;
          auVar12._24_8_ = uStack_ce8;
          local_12e0 = vpminsw_avx2(auVar24,auVar12);
          puVar21 = (undefined8 *)(in_RDX + (long)(local_c44 * in_ECX + local_c48) * 2);
          *puVar21 = wt0_00;
          puVar21[1] = res_unsigned;
          puVar21 = (undefined8 *)(in_RDX + (long)(local_c44 * in_ECX + local_c48 + in_ECX) * 2);
          *puVar21 = data_ref_0_00;
          puVar21[1] = uStack_12c8;
          in_stack_ffffffffffffed10 = wt0_00;
          in_stack_ffffffffffffed18 = res_unsigned;
        }
      }
    }
  }
  return;
}

Assistant:

void av1_highbd_dist_wtd_convolve_2d_copy_avx2(const uint16_t *src,
                                               int src_stride, uint16_t *dst0,
                                               int dst_stride0, int w, int h,
                                               ConvolveParams *conv_params,
                                               int bd) {
  CONV_BUF_TYPE *dst = conv_params->dst;
  int dst_stride = conv_params->dst_stride;

  const int bits =
      FILTER_BITS * 2 - conv_params->round_1 - conv_params->round_0;
  const __m128i left_shift = _mm_cvtsi32_si128(bits);
  const int do_average = conv_params->do_average;
  const int use_dist_wtd_comp_avg = conv_params->use_dist_wtd_comp_avg;
  const int w0 = conv_params->fwd_offset;
  const int w1 = conv_params->bck_offset;
  const __m256i wt0 = _mm256_set1_epi32(w0);
  const __m256i wt1 = _mm256_set1_epi32(w1);
  const __m256i zero = _mm256_setzero_si256();
  int i, j;

  const int offset_0 =
      bd + 2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const int offset = (1 << offset_0) + (1 << (offset_0 - 1));
  const __m256i offset_const = _mm256_set1_epi32(offset);
  const __m256i offset_const_16b = _mm256_set1_epi16(offset);
  const int rounding_shift =
      2 * FILTER_BITS - conv_params->round_0 - conv_params->round_1;
  const __m256i rounding_const = _mm256_set1_epi32((1 << rounding_shift) >> 1);
  const __m256i clip_pixel_to_bd =
      _mm256_set1_epi16(bd == 10 ? 1023 : (bd == 12 ? 4095 : 255));

  assert(bits <= 4);

  if (!(w % 16)) {
    for (i = 0; i < h; i += 1) {
      for (j = 0; j < w; j += 16) {
        const __m256i src_16bit =
            _mm256_loadu_si256((__m256i *)(&src[i * src_stride + j]));

        const __m256i res = _mm256_sll_epi16(src_16bit, left_shift);

        if (do_average) {
          const __m256i data_0 =
              _mm256_loadu_si256((__m256i *)(&dst[i * dst_stride + j]));

          const __m256i data_ref_0_lo = _mm256_unpacklo_epi16(data_0, zero);
          const __m256i data_ref_0_hi = _mm256_unpackhi_epi16(data_0, zero);

          const __m256i res_32b_lo = _mm256_unpacklo_epi16(res, zero);
          const __m256i res_unsigned_lo =
              _mm256_add_epi32(res_32b_lo, offset_const);

          const __m256i comp_avg_res_lo =
              highbd_comp_avg(&data_ref_0_lo, &res_unsigned_lo, &wt0, &wt1,
                              use_dist_wtd_comp_avg);

          const __m256i res_32b_hi = _mm256_unpackhi_epi16(res, zero);
          const __m256i res_unsigned_hi =
              _mm256_add_epi32(res_32b_hi, offset_const);

          const __m256i comp_avg_res_hi =
              highbd_comp_avg(&data_ref_0_hi, &res_unsigned_hi, &wt0, &wt1,
                              use_dist_wtd_comp_avg);

          const __m256i round_result_lo = highbd_convolve_rounding(
              &comp_avg_res_lo, &offset_const, &rounding_const, rounding_shift);
          const __m256i round_result_hi = highbd_convolve_rounding(
              &comp_avg_res_hi, &offset_const, &rounding_const, rounding_shift);

          const __m256i res_16b =
              _mm256_packus_epi32(round_result_lo, round_result_hi);
          const __m256i res_clip = _mm256_min_epi16(res_16b, clip_pixel_to_bd);

          _mm256_store_si256((__m256i *)(&dst0[i * dst_stride0 + j]), res_clip);
        } else {
          const __m256i res_unsigned_16b =
              _mm256_adds_epu16(res, offset_const_16b);

          _mm256_store_si256((__m256i *)(&dst[i * dst_stride + j]),
                             res_unsigned_16b);
        }
      }
    }
  } else if (!(w % 4)) {
    for (i = 0; i < h; i += 2) {
      for (j = 0; j < w; j += 8) {
        const __m128i src_row_0 =
            _mm_loadu_si128((__m128i *)(&src[i * src_stride + j]));
        const __m128i src_row_1 =
            _mm_loadu_si128((__m128i *)(&src[i * src_stride + j + src_stride]));
        // since not all compilers yet support _mm256_set_m128i()
        const __m256i src_10 = _mm256_insertf128_si256(
            _mm256_castsi128_si256(src_row_0), src_row_1, 1);

        const __m256i res = _mm256_sll_epi16(src_10, left_shift);

        if (w - j < 8) {
          if (do_average) {
            const __m256i data_0 = _mm256_castsi128_si256(
                _mm_loadl_epi64((__m128i *)(&dst[i * dst_stride + j])));
            const __m256i data_1 = _mm256_castsi128_si256(_mm_loadl_epi64(
                (__m128i *)(&dst[i * dst_stride + j + dst_stride])));
            const __m256i data_01 =
                _mm256_permute2x128_si256(data_0, data_1, 0x20);

            const __m256i data_ref_0 = _mm256_unpacklo_epi16(data_01, zero);

            const __m256i res_32b = _mm256_unpacklo_epi16(res, zero);
            const __m256i res_unsigned_lo =
                _mm256_add_epi32(res_32b, offset_const);

            const __m256i comp_avg_res =
                highbd_comp_avg(&data_ref_0, &res_unsigned_lo, &wt0, &wt1,
                                use_dist_wtd_comp_avg);

            const __m256i round_result = highbd_convolve_rounding(
                &comp_avg_res, &offset_const, &rounding_const, rounding_shift);

            const __m256i res_16b =
                _mm256_packus_epi32(round_result, round_result);
            const __m256i res_clip =
                _mm256_min_epi16(res_16b, clip_pixel_to_bd);

            const __m128i res_0 = _mm256_castsi256_si128(res_clip);
            const __m128i res_1 = _mm256_extracti128_si256(res_clip, 1);

            _mm_storel_epi64((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
            _mm_storel_epi64(
                (__m128i *)(&dst0[i * dst_stride0 + j + dst_stride0]), res_1);
          } else {
            const __m256i res_unsigned_16b =
                _mm256_adds_epu16(res, offset_const_16b);

            const __m128i res_0 = _mm256_castsi256_si128(res_unsigned_16b);
            const __m128i res_1 = _mm256_extracti128_si256(res_unsigned_16b, 1);

            _mm_storel_epi64((__m128i *)(&dst[i * dst_stride + j]), res_0);
            _mm_storel_epi64((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                             res_1);
          }
        } else {
          if (do_average) {
            const __m256i data_0 = _mm256_castsi128_si256(
                _mm_loadu_si128((__m128i *)(&dst[i * dst_stride + j])));
            const __m256i data_1 = _mm256_castsi128_si256(_mm_loadu_si128(
                (__m128i *)(&dst[i * dst_stride + j + dst_stride])));
            const __m256i data_01 =
                _mm256_permute2x128_si256(data_0, data_1, 0x20);

            const __m256i data_ref_0_lo = _mm256_unpacklo_epi16(data_01, zero);
            const __m256i data_ref_0_hi = _mm256_unpackhi_epi16(data_01, zero);

            const __m256i res_32b_lo = _mm256_unpacklo_epi16(res, zero);
            const __m256i res_unsigned_lo =
                _mm256_add_epi32(res_32b_lo, offset_const);

            const __m256i comp_avg_res_lo =
                highbd_comp_avg(&data_ref_0_lo, &res_unsigned_lo, &wt0, &wt1,
                                use_dist_wtd_comp_avg);

            const __m256i res_32b_hi = _mm256_unpackhi_epi16(res, zero);
            const __m256i res_unsigned_hi =
                _mm256_add_epi32(res_32b_hi, offset_const);

            const __m256i comp_avg_res_hi =
                highbd_comp_avg(&data_ref_0_hi, &res_unsigned_hi, &wt0, &wt1,
                                use_dist_wtd_comp_avg);

            const __m256i round_result_lo =
                highbd_convolve_rounding(&comp_avg_res_lo, &offset_const,
                                         &rounding_const, rounding_shift);
            const __m256i round_result_hi =
                highbd_convolve_rounding(&comp_avg_res_hi, &offset_const,
                                         &rounding_const, rounding_shift);

            const __m256i res_16b =
                _mm256_packus_epi32(round_result_lo, round_result_hi);
            const __m256i res_clip =
                _mm256_min_epi16(res_16b, clip_pixel_to_bd);

            const __m128i res_0 = _mm256_castsi256_si128(res_clip);
            const __m128i res_1 = _mm256_extracti128_si256(res_clip, 1);

            _mm_store_si128((__m128i *)(&dst0[i * dst_stride0 + j]), res_0);
            _mm_store_si128(
                (__m128i *)(&dst0[i * dst_stride0 + j + dst_stride0]), res_1);
          } else {
            const __m256i res_unsigned_16b =
                _mm256_adds_epu16(res, offset_const_16b);
            const __m128i res_0 = _mm256_castsi256_si128(res_unsigned_16b);
            const __m128i res_1 = _mm256_extracti128_si256(res_unsigned_16b, 1);

            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j]), res_0);
            _mm_store_si128((__m128i *)(&dst[i * dst_stride + j + dst_stride]),
                            res_1);
          }
        }
      }
    }
  }
}